

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

ParseResult * toml::parseFile(string *filename)

{
  byte bVar1;
  string *in_RSI;
  ParseResult *in_RDI;
  ifstream ifs;
  allocator *__rhs;
  ParseResult *this;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  string local_278 [32];
  string local_258 [32];
  Value local_238 [2];
  long local_218 [28];
  istream *in_stack_fffffffffffffec8;
  
  this = in_RDI;
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    parse(in_stack_fffffffffffffec8);
  }
  else {
    Value::Value(local_238);
    __rhs = (allocator *)&stack0xfffffffffffffd87;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"could not open file: ",__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    ParseResult::ParseResult(this,&in_RDI->value,(string *)__rhs);
    std::__cxx11::string::~string(local_258);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd87);
    Value::~Value((Value *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  }
  std::ifstream::~ifstream(local_218);
  return this;
}

Assistant:

inline ParseResult parseFile(const std::string& filename)
{
    std::ifstream ifs(filename);
    if (!ifs) {
        return ParseResult(toml::Value(),
                           std::string("could not open file: ") + filename);
    }

    return parse(ifs);
}